

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_debug.h
# Opt level: O1

vector<unsigned_long,_std::allocator<unsigned_long>_> *
phmap::priv::GetHashtableDebugNumProbesHistogram<phmap::priv::(anonymous_namespace)::IntTable>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          IntTable *container)

{
  pointer puVar1;
  ctrl_t *pcVar2;
  slot_type *psVar3;
  ulong uVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  ushort uVar7;
  uint uVar8;
  ulong *puVar9;
  long lVar10;
  size_t sVar11;
  size_t sVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  char *pcVar18;
  bool bVar19;
  __m128i match;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  probe_seq<16UL> local_48;
  char cVar23;
  char cVar25;
  char cVar26;
  char cVar27;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar18 = (container->
            super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
            ).ctrl_;
  puVar9 = (ulong *)(container->
                    super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                    ).slots_;
  cVar23 = *pcVar18;
  while (cVar23 < -1) {
    auVar20[0] = -(*pcVar18 < -1);
    auVar20[1] = -(pcVar18[1] < -1);
    auVar20[2] = -(pcVar18[2] < -1);
    auVar20[3] = -(pcVar18[3] < -1);
    auVar20[4] = -(pcVar18[4] < -1);
    auVar20[5] = -(pcVar18[5] < -1);
    auVar20[6] = -(pcVar18[6] < -1);
    auVar20[7] = -(pcVar18[7] < -1);
    auVar20[8] = -(pcVar18[8] < -1);
    auVar20[9] = -(pcVar18[9] < -1);
    auVar20[10] = -(pcVar18[10] < -1);
    auVar20[0xb] = -(pcVar18[0xb] < -1);
    auVar20[0xc] = -(pcVar18[0xc] < -1);
    auVar20[0xd] = -(pcVar18[0xd] < -1);
    auVar20[0xe] = -(pcVar18[0xe] < -1);
    auVar20[0xf] = -(pcVar18[0xf] < -1);
    uVar8 = (ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar20[0xf] >> 7) << 0xf) + 1;
    uVar5 = 0;
    if (uVar8 != 0) {
      for (; (uVar8 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
      }
    }
    puVar9 = puVar9 + uVar5;
    cVar23 = pcVar18[uVar5];
    pcVar18 = pcVar18 + uVar5;
  }
  do {
    pcVar2 = (container->
             super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
             ).ctrl_;
    if (pcVar18 ==
        pcVar2 + (container->
                 super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                 ).capacity_) {
      return __return_storage_ptr__;
    }
    if (pcVar2 == (ctrl_t *)0x0) {
      uVar16 = 0;
    }
    else {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *puVar9;
      uVar15 = SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar6,8) +
               SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar6,0);
      raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
      ::probe(&local_48,
              &container->
               super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
              ,uVar15);
      psVar3 = (container->
               super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
               ).slots_;
      uVar16 = uVar15 & 0xffffffffffffff7f;
      auVar20 = ZEXT416((CONCAT11((char)uVar15,(char)uVar15) & 0xff7f) & 0xffff7fff);
      auVar20 = pshuflw(auVar20,auVar20,0);
      uVar15 = *puVar9;
      uVar14 = 0;
      sVar11 = local_48.offset_;
      sVar12 = local_48.index_;
      do {
        auVar6 = *(undefined1 (*) [16])
                  ((container->
                   super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                   ).ctrl_ + sVar11);
        cVar23 = auVar20[0];
        auVar24[0] = -(cVar23 == auVar6[0]);
        cVar25 = auVar20[1];
        auVar24[1] = -(cVar25 == auVar6[1]);
        cVar26 = auVar20[2];
        auVar24[2] = -(cVar26 == auVar6[2]);
        cVar27 = auVar20[3];
        auVar24[3] = -(cVar27 == auVar6[3]);
        auVar24[4] = -(cVar23 == auVar6[4]);
        auVar24[5] = -(cVar25 == auVar6[5]);
        auVar24[6] = -(cVar26 == auVar6[6]);
        auVar24[7] = -(cVar27 == auVar6[7]);
        auVar24[8] = -(cVar23 == auVar6[8]);
        auVar24[9] = -(cVar25 == auVar6[9]);
        auVar24[10] = -(cVar26 == auVar6[10]);
        auVar24[0xb] = -(cVar27 == auVar6[0xb]);
        auVar24[0xc] = -(cVar23 == auVar6[0xc]);
        auVar24[0xd] = -(cVar25 == auVar6[0xd]);
        auVar24[0xe] = -(cVar26 == auVar6[0xe]);
        auVar24[0xf] = -(cVar27 == auVar6[0xf]);
        uVar7 = (ushort)(SUB161(auVar24 >> 7,0) & 1) | (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe | (ushort)(auVar24[0xf] >> 7) << 0xf;
        bVar19 = uVar7 == 0;
        if (!bVar19) {
          uVar8 = (uint)uVar7;
          uVar5 = 0;
          if (uVar7 != 0) {
            for (; (uVar7 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
            }
          }
          uVar4 = psVar3[uVar5 + sVar11 & local_48.mask_];
          uVar13 = (uVar15 != uVar4) + uVar14;
          uVar17 = uVar14;
          if (uVar15 != uVar4) {
            do {
              uVar14 = uVar13;
              uVar8 = uVar8 - 1 & uVar8;
              bVar19 = uVar8 == 0;
              if (bVar19) goto LAB_0012dc0b;
              uVar5 = 0;
              if (uVar8 != 0) {
                for (; (uVar8 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                }
              }
              bVar19 = uVar15 != psVar3[uVar5 + sVar11 & local_48.mask_];
              uVar13 = uVar14 + 1;
            } while (bVar19);
            uVar13 = ((ulong)bVar19 + uVar14 + 1) - 1;
            uVar17 = uVar14;
          }
          bVar19 = false;
          uVar14 = uVar13;
          uVar16 = uVar17;
        }
LAB_0012dc0b:
        if (bVar19) {
          auVar21[0] = -(auVar6[0] == -0x80);
          auVar21[1] = -(auVar6[1] == -0x80);
          auVar21[2] = -(auVar6[2] == -0x80);
          auVar21[3] = -(auVar6[3] == -0x80);
          auVar21[4] = -(auVar6[4] == -0x80);
          auVar21[5] = -(auVar6[5] == -0x80);
          auVar21[6] = -(auVar6[6] == -0x80);
          auVar21[7] = -(auVar6[7] == -0x80);
          auVar21[8] = -(auVar6[8] == -0x80);
          auVar21[9] = -(auVar6[9] == -0x80);
          auVar21[10] = -(auVar6[10] == -0x80);
          auVar21[0xb] = -(auVar6[0xb] == -0x80);
          auVar21[0xc] = -(auVar6[0xc] == -0x80);
          auVar21[0xd] = -(auVar6[0xd] == -0x80);
          auVar21[0xe] = -(auVar6[0xe] == -0x80);
          auVar21[0xf] = -(auVar6[0xf] == -0x80);
          if ((((((((((((((((auVar21 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar21 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar21 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar21 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar21 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar21 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar21 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar21 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar21 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar21 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar21 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar21 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar21 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar21 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar21 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar21[0xf]) {
            lVar10 = sVar11 + sVar12;
            sVar12 = sVar12 + 0x10;
            sVar11 = lVar10 + 0x10U & local_48.mask_;
            uVar14 = uVar14 + 1;
            bVar19 = true;
          }
          else {
            bVar19 = false;
            uVar16 = uVar14;
          }
        }
        else {
          bVar19 = false;
        }
      } while (bVar19);
    }
    uVar15 = (long)(__return_storage_ptr__->
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(__return_storage_ptr__->
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    if (uVar15 <= uVar16 + 1) {
      uVar15 = uVar16 + 1;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (__return_storage_ptr__,uVar15);
    puVar1 = (__return_storage_ptr__->
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start + uVar16;
    *puVar1 = *puVar1 + 1;
    puVar9 = puVar9 + 1;
    cVar23 = pcVar18[1];
    pcVar18 = pcVar18 + 1;
    while (cVar23 < -1) {
      auVar22[0] = -(*pcVar18 < -1);
      auVar22[1] = -(pcVar18[1] < -1);
      auVar22[2] = -(pcVar18[2] < -1);
      auVar22[3] = -(pcVar18[3] < -1);
      auVar22[4] = -(pcVar18[4] < -1);
      auVar22[5] = -(pcVar18[5] < -1);
      auVar22[6] = -(pcVar18[6] < -1);
      auVar22[7] = -(pcVar18[7] < -1);
      auVar22[8] = -(pcVar18[8] < -1);
      auVar22[9] = -(pcVar18[9] < -1);
      auVar22[10] = -(pcVar18[10] < -1);
      auVar22[0xb] = -(pcVar18[0xb] < -1);
      auVar22[0xc] = -(pcVar18[0xc] < -1);
      auVar22[0xd] = -(pcVar18[0xd] < -1);
      auVar22[0xe] = -(pcVar18[0xe] < -1);
      auVar22[0xf] = -(pcVar18[0xf] < -1);
      uVar8 = (ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar22[0xf] >> 7) << 0xf) + 1;
      uVar5 = 0;
      if (uVar8 != 0) {
        for (; (uVar8 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      puVar9 = puVar9 + uVar5;
      cVar23 = pcVar18[uVar5];
      pcVar18 = pcVar18 + uVar5;
    }
  } while( true );
}

Assistant:

std::vector<size_t> GetHashtableDebugNumProbesHistogram(const C& container) {
  std::vector<size_t> v;
  for (auto it = container.begin(); it != container.end(); ++it) {
    size_t num_probes = GetHashtableDebugNumProbes(
        container,
        phmap::priv::hashtable_debug_internal::GetKey<C>(*it, 0));
    v.resize((std::max)(v.size(), num_probes + 1));
    v[num_probes]++;
  }
  return v;
}